

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::RangeGenerator<int,_int>::Iterator::Iterator(Iterator *this,Iterator *other)

{
  int iVar1;
  
  (this->super_ParamIteratorInterface<int>)._vptr_ParamIteratorInterface =
       (_func_int **)&PTR__ParamIteratorInterface_0163ff20;
  this->base_ = other->base_;
  iVar1 = other->index_;
  this->value_ = other->value_;
  this->index_ = iVar1;
  this->step_ = other->step_;
  return;
}

Assistant:

Iterator(const Iterator& other)
        : ParamIteratorInterface<T>(),
          base_(other.base_),
          value_(other.value_),
          index_(other.index_),
          step_(other.step_) {}